

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test
          (tuple<long,_double,_double> *__return_storage_ptr__,FastText *this,istream *in,int32_t k,
          real threshold)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  undefined1 local_98 [88];
  undefined1 auStack_40 [16];
  __node_base_ptr p_Stack_30;
  bool local_28;
  
  local_98._56_8_ = &p_Stack_30;
  local_98._0_8_ = 0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  local_98._24_8_ = (pointer)0x0;
  local_98._32_8_ = (pointer)0x0;
  local_98._40_8_ = (pointer)0x0;
  local_98._48_8_ = 0;
  local_98._64_8_ = 1;
  local_98._72_16_ = ZEXT416(0) << 0x40;
  auStack_40._0_8_ = 0x3f800000;
  local_28 = false;
  unique0x100002de = local_98._72_16_;
  test(this,in,k,threshold,(Meter *)local_98);
  uVar1 = local_98._48_8_;
  dVar2 = Meter::precision((Meter *)local_98);
  dVar3 = Meter::recall((Meter *)local_98);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl = dVar3;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl = dVar2;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Head_base<0UL,_long,_false>._M_head_impl = uVar1;
  std::
  _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_98 + 0x38));
  if ((pointer)local_98._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._24_8_,local_98._40_8_ - local_98._24_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter(false);
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}